

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O0

size_t __thiscall
absl::lts_20250127::str_format_internal::(anonymous_namespace)::
PrintIntegralDigits<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1,unsigned__int128>
          (_anonymous_namespace_ *this,unsigned___int128 digits,Buffer *out)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  Buffer *in_RDX;
  ulong uVar5;
  size_t local_38;
  size_t printed;
  Buffer *out_local;
  unsigned___int128 digits_local;
  
  local_38 = 0;
  out_local = (Buffer *)this;
  digits_local._0_8_ = out;
  if (this != (_anonymous_namespace_ *)0x0 || out != (Buffer *)0x0) {
    while (out_local != (Buffer *)0x0 || (Buffer *)digits_local != (Buffer *)0x0) {
      uVar2 = (long)(Buffer *)digits_local << 0x3f | (ulong)out_local >> 1;
      uVar2 = uVar2 + ((ulong)(Buffer *)digits_local >> 1) +
              (ulong)CARRY8(uVar2,(ulong)(Buffer *)digits_local >> 1);
      anon_unknown_0::Buffer::push_front
                (in_RDX,((byte)out_local & 1) + ((char)uVar2 + (char)(uVar2 / 5) * -5) * '\x02' |
                        0x30);
      uVar4 = (ulong)(Buffer *)digits_local >> 1;
      uVar2 = (long)(Buffer *)digits_local << 0x3f | (ulong)out_local >> 1;
      uVar5 = (uVar2 + uVar4 + (ulong)CARRY8(uVar2,uVar4)) % 5;
      uVar3 = uVar2 - uVar5;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar3;
      digits_local._0_8_ =
           (Buffer *)
           (SUB168(auVar1 * ZEXT816(0xcccccccccccccccd),8) + uVar3 * -0x3333333333333334 +
           (uVar4 - (uVar2 < uVar5)) * -0x3333333333333333);
      out_local = SUB168(auVar1 * ZEXT816(0xcccccccccccccccd),0);
    }
    local_38 = anon_unknown_0::Buffer::size(in_RDX);
    anon_unknown_0::Buffer::push_front(in_RDX,*in_RDX->begin);
    in_RDX->begin[1] = '.';
  }
  return local_38;
}

Assistant:

size_t PrintIntegralDigits(Int digits, Buffer* out) {
  size_t printed = 0;
  if (digits) {
    for (; digits; digits /= 10) out->push_front(digits % 10 + '0');
    printed = out->size();
    if (mode == FormatStyle::Precision) {
      out->push_front(*out->begin);
      out->begin[1] = '.';
    } else {
      out->push_back('.');
    }
  } else if (mode == FormatStyle::Fixed) {
    out->push_front('0');
    out->push_back('.');
    printed = 1;
  }
  return printed;
}